

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O1

Gnuplot * __thiscall Gnuplot::set_xrange(Gnuplot *this,double iFrom,double iTo)

{
  ostream *poVar1;
  ostringstream local_1c0 [8];
  ostringstream cmdstr;
  ios_base local_150 [264];
  string local_48;
  double local_28;
  double local_20;
  
  local_28 = iFrom;
  local_20 = iTo;
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"set xrange[",0xb);
  poVar1 = std::ostream::_M_insert<double>(local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = std::ostream::_M_insert<double>(local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::__cxx11::stringbuf::str();
  cmd(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  std::ios_base::~ios_base(local_150);
  return this;
}

Assistant:

Gnuplot& Gnuplot::set_xrange(const double iFrom, const double iTo) {
  std::ostringstream cmdstr;

  cmdstr << "set xrange[" << iFrom << ":" << iTo << "]";
  cmd(cmdstr.str());

  return *this;
}